

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O3

int areadshort(char *file,short **data_ref,int *length_ref)

{
  ushort *puVar1;
  uint uVar2;
  int __fd;
  ssize_t sVar3;
  short *__buf;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  uint local_3c;
  uint *local_38;
  
  __fd = open(file,0,0x1a4);
  if (__fd < 0) {
    areadshort_cold_4();
  }
  else {
    sVar3 = read(__fd,&local_3c,4);
    if (sVar3 == 4) {
      uVar6 = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
              local_3c << 0x18;
      if (data_ref == (short **)0x0) {
        close(__fd);
        if (length_ref == (int *)0x0) {
          return uVar6;
        }
        *length_ref = uVar6;
        return uVar6;
      }
      uVar2 = uVar6 * 2;
      local_38 = (uint *)length_ref;
      __buf = (short *)malloc((ulong)uVar2);
      if (__buf == (short *)0x0) {
        areadshort_cold_3();
      }
      else {
        sVar4 = read(__fd,__buf,(long)(int)uVar2);
        if (sVar4 == (long)(int)uVar2) {
          close(__fd);
          *data_ref = __buf;
          if (0 < (int)uVar6) {
            uVar5 = 0;
            do {
              puVar1 = (ushort *)(__buf + uVar5);
              *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              uVar5 = uVar5 + 1;
            } while (uVar6 != uVar5);
          }
          *local_38 = uVar6;
          return uVar6;
        }
        areadshort_cold_2();
      }
    }
    else {
      areadshort_cold_1();
    }
  }
  return -1;
}

Assistant:

int
areadshort (char *file,
	    short **data_ref,
	    int *length_ref)
{
  int             fd;
  int             length;
  int             size;
  int             offset;
  char           *data;

  if ((fd = open (file, O_RDONLY | O_BINARY, 0644)) < 0)
  {
    fprintf (stderr, "areadshort: %s: can't open\n", file);
    perror("");
    return -1;
  }
  if (read (fd, (char *) &length, 4) != 4)
  {
    fprintf (stderr, "areadshort: %s: can't read length (empty file?)\n", file);
    perror("");
    close (fd);
    return -1;
  }
  SWAP_INT32(&length);
  /* Just get the file size if we were not given a buffer. */
  if (data_ref == NULL) {
	  close(fd);
	  if (length_ref)
	    *length_ref = length;
	  return length;
  }

  size = length * sizeof (short);
  if (!(data = malloc ((unsigned) size)))
  {
    fprintf (stderr, "areadshort: %s: can't alloc data\n", file);
    perror("");
    close (fd);
    return -1;
  }
  if (read (fd, data, size) != size)
  {
    fprintf (stderr, "areadshort: %s: can't read data\n", file);
    perror("");
    close (fd);
    free (data);
    return -1;
  }
  close (fd);
  *data_ref = (short *) data;
  for(offset = 0; offset < length; offset++)
    SWAP_INT16(*data_ref + offset);
  *length_ref = length;
  return length;
}